

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::DoBinop<int,int>(Thread *this,BinopTrapFunc<int,_int> *f,Ptr *out_trap)

{
  RunResult RVar1;
  undefined8 extraout_RDX;
  Value VVar2;
  Value VVar3;
  int out;
  string msg;
  uint local_4c;
  string local_48;
  
  VVar2 = Pop(this);
  VVar3 = Pop(this);
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  RVar1 = (*f)(VVar3.i32_,VVar2.i32_,(int *)&local_4c,&local_48);
  if (RVar1 == Trap) {
    DoBinop<int,int>();
    RVar1 = Trap;
  }
  else {
    VVar2.i64_._4_4_ = 0;
    VVar2.i32_ = local_4c;
    VVar2._8_8_ = extraout_RDX;
    Push(this,VVar2);
    RVar1 = Ok;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return RVar1;
}

Assistant:

RunResult Thread::DoBinop(BinopTrapFunc<R, T> f, Trap::Ptr* out_trap) {
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  T out;
  std::string msg;
  TRAP_IF(f(lhs, rhs, &out, &msg) == RunResult::Trap, msg);
  Push<R>(out);
  return RunResult::Ok;
}